

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

int mbedtls_des_key_check_key_parity(uchar *key)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (key[lVar1] != odd_parity_table[key[lVar1] >> 1]) {
      return 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return 0;
}

Assistant:

int mbedtls_des_key_check_key_parity( const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    for( i = 0; i < MBEDTLS_DES_KEY_SIZE; i++ )
        if( key[i] != odd_parity_table[key[i] / 2] )
            return( 1 );

    return( 0 );
}